

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void qt_alphamapblit_generic
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uchar *map,int mapWidth,
               int mapHeight,int mapStride,QClipData *clip,bool useGammaCorrection)

{
  long lVar1;
  DestFetchProc64 p_Var2;
  DestStoreProc64 p_Var3;
  ClipLine *pCVar4;
  QT_FT_Span *pQVar5;
  int iVar6;
  int iVar7;
  QRgba64 *pQVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  uint len;
  uchar *puVar14;
  int iVar15;
  long in_FS_OFFSET;
  QRgba64 local_4098;
  QColorTrcLut *local_4090;
  QRgba64 buffer [2048];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_4098 = (QRgba64)color->rgba;
  if (local_4098.rgba >> 0x30 != 0) {
    if (useGammaCorrection) {
      local_4090 = QGuiApplicationPrivate::colorProfileForA8Text(QGuiApplicationPrivate::self);
      local_4098 = (QRgba64)color->rgba;
      if (local_4090 == (QColorTrcLut *)0x0) {
        local_4090 = (QColorTrcLut *)0x0;
      }
      else if ((short)(local_4098.rgba >> 0x30) == -1) {
        local_4098 = QColorTrcLut::toLinear(local_4090,local_4098);
      }
    }
    else {
      local_4090 = (QColorTrcLut *)0x0;
    }
    p_Var2 = destFetchProc64[rasterBuffer->format];
    p_Var3 = destStoreProc64[rasterBuffer->format];
    if (clip == (QClipData *)0x0) {
      iVar9 = 0;
      if (mapHeight < 1) {
        mapHeight = iVar9;
      }
      for (; iVar9 != mapHeight; iVar9 = iVar9 + 1) {
        iVar7 = x;
        for (uVar12 = mapWidth; 0 < (int)uVar12; uVar12 = uVar12 - len) {
          len = 0x800;
          if (uVar12 < 0x800) {
            len = uVar12;
          }
          pQVar8 = (*p_Var2)(buffer,rasterBuffer,iVar7,iVar9 + y,len);
          qt_alphamapblit_generic_oneline
                    (map + ((long)iVar7 - (long)x),len,local_4098,pQVar8,(QRgba64)color->rgba,
                     local_4090);
          if (p_Var3 != (DestStoreProc64)0x0) {
            (*p_Var3)(rasterBuffer,iVar7,iVar9 + y,pQVar8,len);
          }
          iVar7 = iVar7 + len;
        }
        map = map + mapStride;
      }
    }
    else {
      iVar9 = mapHeight + y;
      if (rasterBuffer->m_height <= mapHeight + y) {
        iVar9 = rasterBuffer->m_height;
      }
      uVar11 = 0;
      if (0 < y) {
        uVar11 = (ulong)(uint)y;
      }
      puVar14 = map + ((int)uVar11 - y) * mapStride;
      QClipData::initialize(clip);
      for (; (long)uVar11 < (long)iVar9; uVar11 = uVar11 + 1) {
        pCVar4 = clip->m_clipLines;
        lVar13 = 8;
        for (lVar10 = 0; lVar10 < pCVar4[uVar11].count; lVar10 = lVar10 + 1) {
          pQVar5 = pCVar4[uVar11].spans;
          iVar7 = *(int *)((long)pQVar5 + lVar13 + -8);
          iVar6 = x;
          if (x < iVar7) {
            iVar6 = iVar7;
          }
          iVar7 = iVar7 + *(int *)((long)pQVar5 + lVar13 + -4);
          iVar15 = mapWidth + x;
          if (iVar7 <= mapWidth + x) {
            iVar15 = iVar7;
          }
          iVar7 = iVar15 - iVar6;
          if (iVar7 != 0 && iVar6 <= iVar15) {
            pQVar8 = (*p_Var2)(buffer,rasterBuffer,iVar6,*(int *)((long)&pQVar5->x + lVar13),iVar7);
            qt_alphamapblit_generic_oneline
                      (puVar14 + ((long)iVar6 - (long)x),iVar7,local_4098,pQVar8,
                       (QRgba64)color->rgba,local_4090);
            if (p_Var3 != (DestStoreProc64)0x0) {
              (*p_Var3)(rasterBuffer,iVar6,*(int *)((long)&pQVar5->x + lVar13),pQVar8,iVar7);
            }
          }
          lVar13 = lVar13 + 0x10;
        }
        puVar14 = puVar14 + mapStride;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_alphamapblit_generic(QRasterBuffer *rasterBuffer,
                                    int x, int y, const QRgba64 &color,
                                    const uchar *map,
                                    int mapWidth, int mapHeight, int mapStride,
                                    const QClipData *clip, bool useGammaCorrection)
{
    if (color.isTransparent())
        return;

    const QColorTrcLut *colorProfile = nullptr;

    if (useGammaCorrection)
        colorProfile = QGuiApplicationPrivate::instance()->colorProfileForA8Text();

    QRgba64 srcColor = color;
    if (colorProfile && color.isOpaque())
        srcColor = colorProfile->toLinear(srcColor);

    alignas(8) Q_DECL_UNINITIALIZED QRgba64 buffer[BufferSize];
    const DestFetchProc64 destFetch64 = destFetchProc64[rasterBuffer->format];
    const DestStoreProc64 destStore64 = destStoreProc64[rasterBuffer->format];

    if (!clip) {
        for (int ly = 0; ly < mapHeight; ++ly) {
            int i = x;
            int length = mapWidth;
            while (length > 0) {
                int l = qMin(BufferSize, length);

                QRgba64 *dest = destFetch64(buffer, rasterBuffer, i, y + ly, l);
                qt_alphamapblit_generic_oneline(map + i - x, l,
                                                srcColor, dest, color,
                                                colorProfile);
                if (destStore64)
                    destStore64(rasterBuffer, i, y + ly, dest, l);
                length -= l;
                i += l;
            }
            map += mapStride;
        }
    } else {
        int bottom = qMin(y + mapHeight, rasterBuffer->height());

        int top = qMax(y, 0);
        map += (top - y) * mapStride;

        const_cast<QClipData *>(clip)->initialize();
        for (int yp = top; yp<bottom; ++yp) {
            const QClipData::ClipLine &line = clip->m_clipLines[yp];

            for (int i=0; i<line.count; ++i) {
                const QT_FT_Span &clip = line.spans[i];

                int start = qMax<int>(x, clip.x);
                int end = qMin<int>(x + mapWidth, clip.x + clip.len);
                if (end <= start)
                    continue;
                Q_ASSERT(end - start <= BufferSize);
                QRgba64 *dest = destFetch64(buffer, rasterBuffer, start, clip.y, end - start);
                qt_alphamapblit_generic_oneline(map + start - x, end - start,
                                                srcColor, dest, color,
                                                colorProfile);
                if (destStore64)
                    destStore64(rasterBuffer, start, clip.y, dest, end - start);
            } // for (i -> line.count)
            map += mapStride;
        } // for (yp -> bottom)
    }
}